

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

string * __thiscall wasm::Struct::toString_abi_cxx11_(string *__return_storage_ptr__,Struct *this)

{
  ostringstream local_1a8 [8];
  ostringstream ss;
  ios_base local_138 [264];
  Struct local_30;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_30.fields,&this->fields);
  wasm::operator<<((ostream *)local_1a8,&local_30);
  if (local_30.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.fields.
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.fields.
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Struct::toString() const { return genericToString(*this); }